

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

void __thiscall Snes_Spc::cpu_write(Snes_Spc *this,int data,int addr,rel_time_t time)

{
  int time_00;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int reg;
  int time_01;
  
  *(char *)(in_RDI + 0xb64 + (long)in_EDX) = (char)in_ESI;
  time_00 = in_EDX + -0xf0;
  if (-1 < time_00) {
    time_01 = (int)((ulong)in_RDI >> 0x20);
    if (time_00 < 0x10) {
      *(char *)(in_RDI + 0x848 + (long)time_00) = (char)in_ESI;
      if ((time_00 != 2) && ((time_00 < 4 || (7 < time_00)))) {
        cpu_write_smp_reg((Snes_Spc *)CONCAT44(in_ESI,in_EDX),in_ECX,time_00,time_01);
      }
    }
    else if (-1 < in_EDX + -0xffc0) {
      cpu_write_high((Snes_Spc *)CONCAT44(in_ESI,in_EDX),in_ECX,in_EDX + -0xffc0,time_01);
    }
  }
  return;
}

Assistant:

void Snes_Spc::cpu_write( int data, int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	RAM [addr] = (uint8_t) data;
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 64%
	{
		// $F0-$FF
		if ( reg < reg_count ) // 87%
		{
			REGS [reg] = (uint8_t) data;
			
			// Ports
			#ifdef SPC_PORT_WRITE_HOOK
				if ( (unsigned) (reg - r_cpuio0) < port_count )
					SPC_PORT_WRITE_HOOK( m.spc_time + time, (reg - r_cpuio0),
							(uint8_t) data, &REGS [r_cpuio0] );
			#endif
			
			// Registers other than $F2 and $F4-$F7
			if ( reg != 2 && (reg < 4 || reg > 7) ) // 36%
				cpu_write_smp_reg( data, time, reg );
		}
		// High mem/address wrap-around
		else
		{
			reg -= rom_addr - 0xF0;
			if ( reg >= 0 ) // 1% in IPL ROM area or address wrapped around
				cpu_write_high( data, reg, time );
		}
	}
}